

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O3

void __thiscall
draco::PointAttribute::Init
          (PointAttribute *this,Type attribute_type,int8_t num_components,DataType data_type,
          bool normalized,size_t num_attribute_values)

{
  DataBuffer *__ptr;
  pointer pIVar1;
  int32_t iVar2;
  _Head_base<0UL,_draco::DataBuffer_*,_false> this_00;
  
  this_00._M_head_impl = (DataBuffer *)operator_new(0x28);
  DataBuffer::DataBuffer(this_00._M_head_impl);
  __ptr = (this->attribute_buffer_)._M_t.
          super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>._M_t.
          super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
          super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl;
  (this->attribute_buffer_)._M_t.
  super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>._M_t.
  super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
  super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl = this_00._M_head_impl;
  if (__ptr != (DataBuffer *)0x0) {
    std::default_delete<draco::DataBuffer>::operator()
              ((default_delete<draco::DataBuffer> *)&this->attribute_buffer_,__ptr);
    this_00._M_head_impl =
         (this->attribute_buffer_)._M_t.
         super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>._M_t.
         super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
         super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl;
  }
  iVar2 = DataTypeLength(data_type);
  GeometryAttribute::Init
            (&this->super_GeometryAttribute,attribute_type,this_00._M_head_impl,num_components,
             data_type,normalized,(long)(iVar2 * num_components),0);
  Reset(this,num_attribute_values);
  this->identity_mapping_ = true;
  pIVar1 = (this->indices_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->indices_map_).vector_.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar1) {
    (this->indices_map_).vector_.
    super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar1;
  }
  return;
}

Assistant:

void PointAttribute::Init(Type attribute_type, int8_t num_components,
                          DataType data_type, bool normalized,
                          size_t num_attribute_values) {
  attribute_buffer_ = std::unique_ptr<DataBuffer>(new DataBuffer());
  GeometryAttribute::Init(attribute_type, attribute_buffer_.get(),
                          num_components, data_type, normalized,
                          DataTypeLength(data_type) * num_components, 0);
  Reset(num_attribute_values);
  SetIdentityMapping();
}